

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

bool NULLC::IsDerivedFrom(NULLCRef derived,uint base)

{
  uint uVar1;
  char *pcVar2;
  NULLCRef *pNVar3;
  
  if (*(uint *)(linker + 0x20c) <= base) {
LAB_00120198:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x7f,
                  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
                 );
  }
  if ((*(byte *)(*(long *)(linker + 0x200) + 0x15 + (ulong)base * 0x50) & 4) == 0) {
    pcVar2 = nullcGetTypeName(base);
    nullcThrowError("ERROR: type \'%s\' is not extendable",pcVar2);
  }
  pNVar3 = &derived;
  do {
    uVar1 = pNVar3->typeID;
    if (uVar1 == base) break;
    if (*(uint *)(linker + 0x20c) <= uVar1) goto LAB_00120198;
    pNVar3 = (NULLCRef *)(*(long *)(linker + 0x200) + (ulong)uVar1 * 0x50 + 0x4c);
  } while (pNVar3->typeID != 0);
  return uVar1 == base;
}

Assistant:

bool NULLC::IsDerivedFrom(NULLCRef derived, unsigned base)
{
	if((linker->exTypes[base].typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) == 0)
		nullcThrowError("ERROR: type '%s' is not extendable", nullcGetTypeName(base));

	unsigned typeId = derived.typeID;

	for(;;)
	{
		if(base == typeId)
			return true;

		if(linker->exTypes[typeId].baseType)
		{
			typeId = linker->exTypes[typeId].baseType;
		}
		else
		{
			break;
		}
	}

	return false;
}